

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grain_table.c
# Opt level: O0

aom_codec_err_t
aom_film_grain_table_read
          (aom_film_grain_table_t *t,char *filename,aom_internal_error_info *error_info)

{
  int iVar1;
  size_t sVar2;
  void *__s;
  aom_internal_error_info *in_RDX;
  char *in_RSI;
  long *in_RDI;
  aom_film_grain_table_entry_t *entry;
  aom_film_grain_table_entry_t *prev_entry;
  char magic [9];
  FILE *file;
  void *local_40;
  long local_31;
  FILE *local_28;
  aom_internal_error_info *local_20;
  char *local_18;
  long *local_10;
  aom_codec_err_t local_4;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = fopen64(in_RSI,"rb");
  if (local_28 == (FILE *)0x0) {
    aom_internal_error(local_20,AOM_CODEC_ERROR,"Unable to open %s",local_18);
    local_4 = local_20->error_code;
  }
  else {
    local_20->error_code = AOM_CODEC_OK;
    sVar2 = fread(&local_31,9,1,local_28);
    if ((sVar2 == 0) || (local_31 != 0x316e72676d6c6966)) {
      aom_internal_error(local_20,AOM_CODEC_ERROR,"Unable to read (or invalid) file magic");
      fclose(local_28);
      local_4 = local_20->error_code;
    }
    else {
      local_40 = (void *)0x0;
      do {
        iVar1 = feof(local_28);
        if (iVar1 != 0) break;
        __s = aom_malloc(0x3bc258);
        if (__s == (void *)0x0) {
          aom_internal_error(local_20,AOM_CODEC_MEM_ERROR,"Unable to allocate grain table entry");
          break;
        }
        memset(__s,0,0x2a0);
        grain_table_entry_read
                  ((FILE *)error_info,(aom_internal_error_info *)file,
                   (aom_film_grain_table_entry_t *)magic._1_8_);
        *(undefined8 *)((long)__s + 0x298) = 0;
        if (local_40 != (void *)0x0) {
          *(void **)((long)local_40 + 0x298) = __s;
        }
        if (*local_10 == 0) {
          *local_10 = (long)__s;
        }
        local_10[1] = (long)__s;
        local_40 = __s;
      } while (local_20->error_code == AOM_CODEC_OK);
      fclose(local_28);
      local_4 = local_20->error_code;
    }
  }
  return local_4;
}

Assistant:

aom_codec_err_t aom_film_grain_table_read(
    aom_film_grain_table_t *t, const char *filename,
    struct aom_internal_error_info *error_info) {
  FILE *file = fopen(filename, "rb");
  if (!file) {
    aom_internal_error(error_info, AOM_CODEC_ERROR, "Unable to open %s",
                       filename);
    return error_info->error_code;
  }
  error_info->error_code = AOM_CODEC_OK;

  // Read in one extra character as there should be white space after
  // the header.
  char magic[9];
  if (!fread(magic, 9, 1, file) || memcmp(magic, kFileMagic, 8)) {
    aom_internal_error(error_info, AOM_CODEC_ERROR,
                       "Unable to read (or invalid) file magic");
    fclose(file);
    return error_info->error_code;
  }

  aom_film_grain_table_entry_t *prev_entry = NULL;
  while (!feof(file)) {
    aom_film_grain_table_entry_t *entry = aom_malloc(sizeof(*entry));
    if (!entry) {
      aom_internal_error(error_info, AOM_CODEC_MEM_ERROR,
                         "Unable to allocate grain table entry");
      break;
    }
    memset(entry, 0, sizeof(*entry));
    grain_table_entry_read(file, error_info, entry);
    entry->next = NULL;

    if (prev_entry) prev_entry->next = entry;
    if (!t->head) t->head = entry;
    t->tail = entry;
    prev_entry = entry;

    if (error_info->error_code != AOM_CODEC_OK) break;
  }

  fclose(file);
  return error_info->error_code;
}